

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptMath.cpp
# Opt level: O0

Var Js::JavascriptMath::MinInAnArray(RecyclableObject *function,CallInfo callInfo,...)

{
  code *pcVar1;
  bool bVar2;
  int n;
  BOOL BVar3;
  uint32 uVar4;
  ScriptContext *pSVar5;
  ThreadContext *pTVar6;
  Var *values;
  undefined4 *puVar7;
  Var pvVar8;
  Var aValue;
  RecyclableObject *this;
  JavascriptArray *this_00;
  JavascriptLibrary *pJVar9;
  JavascriptNativeArray *this_01;
  SparseArraySegmentBase *pSVar10;
  SparseArraySegmentBase **ppSVar11;
  TypedArrayBase *this_02;
  undefined1 local_e8 [8];
  AutoReentrancyHandler autoReentrancyHandler_2;
  Var min;
  uint len_1;
  TypedArrayBase *argsArray_1;
  AutoReentrancyHandler autoReentrancyHandler_1;
  uint len;
  JavascriptNativeArray *argsArray;
  undefined1 local_90 [8];
  AutoReentrancyHandler autoReentrancyHandler;
  TypeId typeId;
  ScriptContext *scriptContext;
  Var arrayArg;
  Var thisArg;
  ArgumentReader args;
  Var *_argsVarArray;
  RecyclableObject *function_local;
  CallInfo callInfo_local;
  TypeId local_18;
  TypeId typeId_1;
  
  function_local = (RecyclableObject *)callInfo;
  pSVar5 = RecyclableObject::GetScriptContext(function);
  pTVar6 = ScriptContext::GetThreadContext(pSVar5);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  ThreadContext::ProbeStack(pTVar6,0xc00,pSVar5,(PVOID)0x0);
  n = _count_args((CallInfo)function_local);
  values = _get_va(&stack0x00000000,n);
  args.super_Arguments.Values = (Type)function_local;
  bVar2 = CallInfo::operator==((CallInfo *)(values + -1),(CallInfo)function_local);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x49f,
                                "(*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo)",
                                "*reinterpret_cast<Js::CallInfo*>(_argsVarArray - 1) == callInfo");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  ArgumentReader::ArgumentReader((ArgumentReader *)&thisArg,(CallInfo *)&function_local,values);
  if (((uint)thisArg & 0xffffff) != 2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/../Math/JavascriptMath.cpp"
                                ,0x4a0,"(args.Info.Count == 2)","args.Info.Count == 2");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  pvVar8 = Arguments::operator[]((Arguments *)&thisArg,0);
  aValue = Arguments::operator[]((Arguments *)&thisArg,1);
  pSVar5 = RecyclableObject::GetScriptContext(function);
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar7 = 0;
  }
  bVar2 = TaggedInt::Is(aValue);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aValue);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      this = UnsafeVarTo<Js::RecyclableObject>(aValue);
      if (this == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
      local_18 = RecyclableObject::GetTypeId(this);
      if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(this), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar7 = 0;
      }
    }
  }
  autoReentrancyHandler._12_4_ = local_18;
  bVar2 = JavascriptNativeArray::Is(local_18);
  if ((bVar2) ||
     (((BVar3 = Js::TypedArrayBase::Is(autoReentrancyHandler._12_4_), BVar3 != 0 &&
       (autoReentrancyHandler._12_4_ != 0x37)) && (autoReentrancyHandler._12_4_ != 0x38)))) {
    bVar2 = JavascriptNativeArray::Is(autoReentrancyHandler._12_4_);
    if (bVar2) {
      JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<void*>(aValue);
      this_01 = UnsafeVarTo<Js::JavascriptNativeArray>(aValue);
      autoReentrancyHandler_1._12_4_ = ArrayObject::GetLength((ArrayObject *)this_01);
      if (autoReentrancyHandler_1._12_4_ == 0) {
        pJVar9 = ScriptContext::GetLibrary(pSVar5);
        callInfo_local =
             (CallInfo)
             JavascriptLibraryBase::GetPositiveInfinite(&pJVar9->super_JavascriptLibraryBase);
      }
      else {
        pSVar10 = Js::JavascriptArray::GetHead(&this_01->super_JavascriptArray);
        ppSVar11 = Memory::WriteBarrierPtr::operator_cast_to_SparseArraySegmentBase__
                             ((WriteBarrierPtr *)&pSVar10->next);
        if (((*ppSVar11 == (SparseArraySegmentBase *)0x0) &&
            (bVar2 = Js::JavascriptArray::HasNoMissingValues(&this_01->super_JavascriptArray), bVar2
            )) && (pSVar10 = Js::JavascriptArray::GetHead(&this_01->super_JavascriptArray),
                  pSVar10->length == autoReentrancyHandler_1._12_4_)) {
          callInfo_local = (CallInfo)JavascriptNativeArray::FindMinOrMax(this_01,pSVar5,false);
        }
        else {
          pTVar6 = ScriptContext::GetThreadContext(pSVar5);
          AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)&argsArray_1,pTVar6)
          ;
          callInfo_local =
               (CallInfo)
               JavascriptFunction::CalloutHelper<false>(function,pvVar8,(Var)0x0,aValue,pSVar5);
          AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)&argsArray_1);
        }
      }
    }
    else {
      this_02 = UnsafeVarTo<Js::TypedArrayBase>(aValue);
      uVar4 = ArrayObject::GetLength((ArrayObject *)this_02);
      if (uVar4 == 0) {
        pJVar9 = ScriptContext::GetLibrary(pSVar5);
        callInfo_local =
             (CallInfo)
             JavascriptLibraryBase::GetPositiveInfinite(&pJVar9->super_JavascriptLibraryBase);
      }
      else {
        autoReentrancyHandler_2._8_8_ =
             Js::TypedArrayBase::FindMinOrMax(this_02,pSVar5,autoReentrancyHandler._12_4_,false);
        callInfo_local = (CallInfo)autoReentrancyHandler_2._8_8_;
        if ((CallInfo)autoReentrancyHandler_2._8_8_ == (CallInfo)0x0) {
          pTVar6 = ScriptContext::GetThreadContext(pSVar5);
          AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_e8,pTVar6);
          callInfo_local =
               (CallInfo)
               JavascriptFunction::CalloutHelper<false>(function,pvVar8,(Var)0x0,aValue,pSVar5);
          AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_e8);
        }
      }
    }
  }
  else {
    bVar2 = Js::JavascriptArray::IsNonES5Array(autoReentrancyHandler._12_4_);
    if (bVar2) {
      this_00 = UnsafeVarTo<Js::JavascriptArray>(aValue);
      uVar4 = ArrayObject::GetLength(&this_00->super_ArrayObject);
      if (uVar4 == 0) {
        pJVar9 = ScriptContext::GetLibrary(pSVar5);
        pvVar8 = JavascriptLibraryBase::GetPositiveInfinite(&pJVar9->super_JavascriptLibraryBase);
        return pvVar8;
      }
    }
    pTVar6 = ScriptContext::GetThreadContext(pSVar5);
    AutoReentrancyHandler::AutoReentrancyHandler((AutoReentrancyHandler *)local_90,pTVar6);
    callInfo_local =
         (CallInfo)JavascriptFunction::CalloutHelper<false>(function,pvVar8,(Var)0x0,aValue,pSVar5);
    AutoReentrancyHandler::~AutoReentrancyHandler((AutoReentrancyHandler *)local_90);
  }
  return (Var)callInfo_local;
}

Assistant:

Var JavascriptMath::MinInAnArray(RecyclableObject * function, CallInfo callInfo, ...)
        {
            JIT_HELPER_REENTRANT_HEADER(Op_MinInAnArray);
            PROBE_STACK(function->GetScriptContext(), Js::Constants::MinStackDefault);

            ARGUMENTS(args, callInfo);
            Assert(args.Info.Count == 2);
            Var thisArg = args[0];
            Var arrayArg = args[1];

            ScriptContext * scriptContext = function->GetScriptContext();

            TypeId typeId = JavascriptOperators::GetTypeId(arrayArg);
            if (!JavascriptNativeArray::Is(typeId) && !(TypedArrayBase::Is(typeId) && typeId != TypeIds_CharArray && typeId != TypeIds_BoolArray))
            {
                if (JavascriptArray::IsNonES5Array(typeId) && UnsafeVarTo<JavascriptArray>(arrayArg)->GetLength() == 0)
                {
                    return scriptContext->GetLibrary()->GetPositiveInfinite();
                }

                BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                {
                    return JavascriptFunction::CalloutHelper<false>(function, thisArg, /* overridingNewTarget = */nullptr, arrayArg, scriptContext);
                }
                END_SAFE_REENTRANT_CALL
            }

            if (JavascriptNativeArray::Is(typeId))
            {
#if ENABLE_COPYONACCESS_ARRAY
                JavascriptLibrary::CheckAndConvertCopyOnAccessNativeIntArray<Var>(arrayArg);
#endif
                JavascriptNativeArray * argsArray = UnsafeVarTo<JavascriptNativeArray>(arrayArg);
                uint len = argsArray->GetLength();
                if (len == 0)
                {
                    return scriptContext->GetLibrary()->GetPositiveInfinite();
                }

                if (argsArray->GetHead()->next != nullptr || !argsArray->HasNoMissingValues() ||
                    argsArray->GetHead()->length != len)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return JavascriptFunction::CalloutHelper<false>(function, thisArg, /* overridingNewTarget = */nullptr, arrayArg, scriptContext);
                    }
                    END_SAFE_REENTRANT_CALL
                }

                return argsArray->FindMinOrMax(scriptContext, false /*findMax*/);
            }
            else
            {
                TypedArrayBase * argsArray = UnsafeVarTo<TypedArrayBase>(arrayArg);
                uint len = argsArray->GetLength();
                if (len == 0)
                {
                    return scriptContext->GetLibrary()->GetPositiveInfinite();
                }
                Var min = argsArray->FindMinOrMax(scriptContext, typeId, false /*findMax*/);
                if (min == nullptr)
                {
                    BEGIN_SAFE_REENTRANT_CALL(scriptContext->GetThreadContext())
                    {
                        return JavascriptFunction::CalloutHelper<false>(function, thisArg, /* overridingNewTarget = */nullptr, arrayArg, scriptContext);
                    }
                    END_SAFE_REENTRANT_CALL
                }
                return min;
            }
            JIT_HELPER_END(Op_MinInAnArray);
        }